

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::BeginTooltipEx(ImGuiWindowFlags extra_flags,ImGuiTooltipFlags tooltip_flags)

{
  float fVar1;
  ImGuiIO *pIVar2;
  ImGuiWindow *pIVar3;
  ImGuiWindowFlags flags;
  ImGuiWindow *window;
  char window_name [16];
  ImVec2 local_30;
  ImVec2 local_28;
  ImVec2 local_20;
  ImVec2 tooltip_pos;
  ImGuiContext *g;
  ImGuiTooltipFlags tooltip_flags_local;
  ImGuiWindowFlags extra_flags_local;
  
  tooltip_pos = (ImVec2)GImGui;
  if (((GImGui->DragDropWithinSource & 1U) != 0) ||
     (g._0_4_ = tooltip_flags, (GImGui->DragDropWithinTarget & 1U) != 0)) {
    pIVar2 = &GImGui->IO;
    fVar1 = (GImGui->Style).MouseCursorScale;
    ImVec2::ImVec2(&local_28,fVar1 * 16.0,fVar1 * 8.0);
    local_20 = operator+(&pIVar2->MousePos,&local_28);
    ImVec2::ImVec2(&local_30,0.0,0.0);
    SetNextWindowPos(&local_20,0,&local_30);
    SetNextWindowBgAlpha(*(float *)((long)tooltip_pos + 0x1668) * 0.6);
    g._0_4_ = tooltip_flags | 1;
  }
  ImFormatString((char *)&window,0x10,"##Tooltip_%02d",(ulong)*(uint *)((long)tooltip_pos + 0x2f3c))
  ;
  if (((((uint)g & 1) != 0) &&
      (pIVar3 = FindWindowByName((char *)&window), pIVar3 != (ImGuiWindow *)0x0)) &&
     ((pIVar3->Active & 1U) != 0)) {
    pIVar3->Hidden = true;
    pIVar3->HiddenFramesCanSkipItems = 1;
    *(int *)((long)tooltip_pos + 0x2f3c) = *(int *)((long)tooltip_pos + 0x2f3c) + 1;
    ImFormatString((char *)&window,0x10,"##Tooltip_%02d");
  }
  Begin((char *)&window,(bool *)0x0,extra_flags | 0x20c0347);
  return;
}

Assistant:

void ImGui::BeginTooltipEx(ImGuiWindowFlags extra_flags, ImGuiTooltipFlags tooltip_flags)
{
    ImGuiContext& g = *GImGui;

    if (g.DragDropWithinSource || g.DragDropWithinTarget)
    {
        // The default tooltip position is a little offset to give space to see the context menu (it's also clamped within the current viewport/monitor)
        // In the context of a dragging tooltip we try to reduce that offset and we enforce following the cursor.
        // Whatever we do we want to call SetNextWindowPos() to enforce a tooltip position and disable clipping the tooltip without our display area, like regular tooltip do.
        //ImVec2 tooltip_pos = g.IO.MousePos - g.ActiveIdClickOffset - g.Style.WindowPadding;
        ImVec2 tooltip_pos = g.IO.MousePos + ImVec2(16 * g.Style.MouseCursorScale, 8 * g.Style.MouseCursorScale);
        SetNextWindowPos(tooltip_pos);
        SetNextWindowBgAlpha(g.Style.Colors[ImGuiCol_PopupBg].w * 0.60f);
        //PushStyleVar(ImGuiStyleVar_Alpha, g.Style.Alpha * 0.60f); // This would be nice but e.g ColorButton with checkboard has issue with transparent colors :(
        tooltip_flags |= ImGuiTooltipFlags_OverridePreviousTooltip;
    }

    char window_name[16];
    ImFormatString(window_name, IM_ARRAYSIZE(window_name), "##Tooltip_%02d", g.TooltipOverrideCount);
    if (tooltip_flags & ImGuiTooltipFlags_OverridePreviousTooltip)
        if (ImGuiWindow* window = FindWindowByName(window_name))
            if (window->Active)
            {
                // Hide previous tooltip from being displayed. We can't easily "reset" the content of a window so we create a new one.
                window->Hidden = true;
                window->HiddenFramesCanSkipItems = 1;
                ImFormatString(window_name, IM_ARRAYSIZE(window_name), "##Tooltip_%02d", ++g.TooltipOverrideCount);
            }
    ImGuiWindowFlags flags = ImGuiWindowFlags_Tooltip|ImGuiWindowFlags_NoInputs|ImGuiWindowFlags_NoTitleBar|ImGuiWindowFlags_NoMove|ImGuiWindowFlags_NoResize|ImGuiWindowFlags_NoSavedSettings|ImGuiWindowFlags_AlwaysAutoResize;
    Begin(window_name, NULL, flags | extra_flags);
}